

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

bool leveldb::GetVarint64(Slice *input,uint64_t *value)

{
  char *pcVar1;
  size_t sVar2;
  uint64_t *in_RSI;
  Slice *in_RDI;
  bool bVar3;
  char *q;
  char *limit;
  char *p;
  Slice local_40;
  char *local_30;
  char *local_28;
  char *local_20;
  uint64_t *local_18;
  Slice *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  pcVar1 = Slice::data(in_RDI);
  local_20 = pcVar1;
  sVar2 = Slice::size(local_10);
  local_28 = pcVar1 + sVar2;
  local_30 = GetVarint64Ptr(local_20,local_28,local_18);
  bVar3 = local_30 != (char *)0x0;
  if (bVar3) {
    Slice::Slice(&local_40,local_30,(long)local_28 - (long)local_30);
    local_10->data_ = local_40.data_;
    local_10->size_ = local_40.size_;
  }
  return bVar3;
}

Assistant:

bool GetVarint64(Slice* input, uint64_t* value) {
  const char* p = input->data();
  const char* limit = p + input->size();
  const char* q = GetVarint64Ptr(p, limit, value);
  if (q == nullptr) {
    return false;
  } else {
    *input = Slice(q, limit - q);
    return true;
  }
}